

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O3

void helicsCoreSendOrderedCommand(HelicsCore core,char *target,char *command,HelicsError *err)

{
  element_type *peVar1;
  CoreObject *pCVar2;
  size_t sVar3;
  size_t sVar4;
  _Alloc_hider _Var5;
  _Alloc_hider _Var6;
  undefined4 uStack_58;
  undefined1 local_40 [16];
  
  pCVar2 = helics::getCoreObject(core,err);
  if ((pCVar2 != (CoreObject *)0x0) &&
     (peVar1 = (pCVar2->coreptr).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr
     , peVar1 != (element_type *)0x0)) {
    sVar3 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
    _Var6 = gHelicsEmptyStr_abi_cxx11_._M_dataplus;
    if (target != (char *)0x0) {
      sVar3 = strlen(target);
      _Var6._M_p = target;
    }
    sVar4 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
    _Var5._M_p = gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p;
    if (command != (char *)0x0) {
      sVar4 = strlen(command);
      _Var5._M_p = command;
    }
    local_40[0] = 0;
    uStack_58 = SUB84(local_40,0);
    (*peVar1->_vptr_Core[0x5b])(peVar1,sVar3,_Var6._M_p,sVar4,_Var5._M_p,1,0,uStack_58);
  }
  return;
}

Assistant:

void helicsCoreSendOrderedCommand(HelicsCore core, const char* target, const char* command, HelicsError* err)
{
    auto* cppcore = getCore(core, err);
    if (cppcore == nullptr) {
        return;
    }
    try {
        cppcore->sendCommand(AS_STRING_VIEW(target), AS_STRING_VIEW(command), std::string{}, HELICS_SEQUENCING_MODE_ORDERED);
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}